

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

LiteralExpressionSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::LiteralExpressionSyntax,slang::syntax::SyntaxKind&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxKind *args,Token *args_1)

{
  SyntaxKind SVar1;
  Info *pIVar2;
  TokenKind TVar3;
  undefined1 uVar4;
  NumericTokenFlags NVar5;
  uint32_t uVar6;
  LiteralExpressionSyntax *pLVar7;
  
  pLVar7 = (LiteralExpressionSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((LiteralExpressionSyntax *)this->endPtr < pLVar7 + 1) {
    pLVar7 = (LiteralExpressionSyntax *)allocateSlow(this,0x20,8);
  }
  else {
    this->head->current = (byte *)(pLVar7 + 1);
  }
  SVar1 = *args;
  TVar3 = args_1->kind;
  uVar4 = args_1->field_0x2;
  NVar5.raw = (args_1->numFlags).raw;
  uVar6 = args_1->rawLen;
  pIVar2 = args_1->info;
  (pLVar7->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.parent =
       (SyntaxNode *)0x0;
  (pLVar7->super_PrimaryExpressionSyntax).super_ExpressionSyntax.super_SyntaxNode.kind = SVar1;
  (pLVar7->literal).kind = TVar3;
  (pLVar7->literal).field_0x2 = uVar4;
  (pLVar7->literal).numFlags = (NumericTokenFlags)NVar5.raw;
  (pLVar7->literal).rawLen = uVar6;
  (pLVar7->literal).info = pIVar2;
  return pLVar7;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }